

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ActivationLinear *pAVar3;
  bool bVar4;
  undefined1 *puVar5;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  Result *_result;
  string err;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      if (layer->_oneof_case_[0] == 0x3fc) {
        puVar5 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar5 = Specification::_ArgMinLayerParams_default_instance_;
      }
      if (((ConcatNDLayerParams *)puVar5)->interleave_ == false) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ArgMin","");
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        if (layer->_oneof_case_[0] == 0x3fc) {
          puVar5 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar5 = Specification::_ArgMinLayerParams_default_instance_;
        }
        pAVar3 = (((ActivationParams *)puVar5)->NonlinearityType_).linear_;
        lVar7 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[0] + 0x24);
        if ((SBORROW8((long)pAVar3,-lVar7) !=
             (long)&(pAVar3->super_MessageLite)._vptr_MessageLite + lVar7 < 0) ||
           (lVar7 <= (long)pAVar3)) {
          std::operator+(&local_50,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_90.field_2._M_allocated_capacity = *psVar8;
            local_90.field_2._8_8_ = plVar6[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar8;
            local_90._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_90._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p == &local_90.field_2) {
            return __return_storage_ptr__;
          }
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    if (!layer.argmin().removedim()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank));
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}